

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510_tune.c
# Opt level: O0

void vepu510_h265e_tune_aq_prepare(HalH265eVepu510Tune *tune)

{
  MppEncCfgSet *pMVar1;
  MppEncHwCfg *hw;
  H265eV510HalContext *ctx;
  HalH265eVepu510Tune *tune_local;
  
  if (tune != (HalH265eVepu510Tune *)0x0) {
    pMVar1 = tune->ctx->cfg;
    if (tune->ctx->smart_en == 0) {
      memcpy((pMVar1->hw).aq_thrd_i,aq_thd_default,0x40);
      memcpy((pMVar1->hw).aq_thrd_p,aq_thd_default,0x40);
      memcpy((pMVar1->hw).aq_step_i,aq_qp_delta_default,0x40);
      memcpy((pMVar1->hw).aq_step_p,aq_qp_delta_default,0x40);
    }
    else {
      memcpy((pMVar1->hw).aq_thrd_i,aq_thd_smt_I,0x40);
      memcpy((pMVar1->hw).aq_thrd_p,aq_thd_smt_P,0x40);
      memcpy((pMVar1->hw).aq_step_i,aq_qp_delta_smt_I,0x40);
      memcpy((pMVar1->hw).aq_step_p,aq_qp_delta_smt_P,0x40);
    }
  }
  return;
}

Assistant:

static void vepu510_h265e_tune_aq_prepare(HalH265eVepu510Tune *tune)
{
    if (tune == NULL) {
        return;
    }

    H265eV510HalContext *ctx = tune->ctx;
    MppEncHwCfg *hw = &ctx->cfg->hw;

    if (ctx->smart_en) {
        memcpy(hw->aq_thrd_i, aq_thd_smt_I, sizeof(hw->aq_thrd_i));
        memcpy(hw->aq_thrd_p, aq_thd_smt_P, sizeof(hw->aq_thrd_p));
        memcpy(hw->aq_step_i, aq_qp_delta_smt_I, sizeof(hw->aq_step_i));
        memcpy(hw->aq_step_p, aq_qp_delta_smt_P, sizeof(hw->aq_step_p));
    } else {
        memcpy(hw->aq_thrd_i, aq_thd_default, sizeof(hw->aq_thrd_i));
        memcpy(hw->aq_thrd_p, aq_thd_default, sizeof(hw->aq_thrd_p));
        memcpy(hw->aq_step_i, aq_qp_delta_default, sizeof(hw->aq_step_i));
        memcpy(hw->aq_step_p, aq_qp_delta_default, sizeof(hw->aq_step_p));
    }
}